

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O2

void google::protobuf::compiler::java::anon_unknown_2::AddPrimitiveVariableForThisAndOther
               (string_view this_variable_name,string_view other_variable_name,
               FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
               create_value,
               flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char>,_std::__cxx11::basic_string<char>_>_>
  pbVar1;
  VoidPtr VVar2;
  VoidPtr c;
  type tVar3;
  type tVar4;
  string local_120;
  key_arg<std::basic_string_view<char>_> local_100;
  key_arg<std::basic_string_view<char>_> local_f0;
  string local_e0;
  AlphaNum local_c0;
  AlphaNum local_90;
  string_view local_60 [3];
  
  VVar2 = create_value.ptr_;
  local_f0._M_str = this_variable_name._M_str;
  local_f0._M_len = this_variable_name._M_len;
  local_100._M_str = other_variable_name._M_str;
  local_100._M_len = other_variable_name._M_len;
  c = VVar2;
  pbVar1 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[5],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,(key_arg<char[5]> *)0x651c1c);
  local_60[0]._M_str = (pbVar1->_M_dataplus)._M_p;
  local_60[0]._M_len = pbVar1->_M_string_length;
  local_90.piece_ = absl::lts_20250127::NullSafeStringView("_");
  absl::lts_20250127::StrCat_abi_cxx11_(&local_120,(lts_20250127 *)local_60,&local_90,&local_90);
  tVar3._M_str = local_120._M_dataplus._M_p;
  tVar3._M_len = local_120._M_string_length;
  (*create_value.invoker_)
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,VVar2,
             tVar3);
  pbVar1 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,&local_f0);
  std::__cxx11::string::operator=((string *)pbVar1,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_120);
  local_60[0] = absl::lts_20250127::NullSafeStringView("other.get");
  pbVar1 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[17],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,(key_arg<char[17]> *)0x501d20);
  local_90.piece_._M_str = (pbVar1->_M_dataplus)._M_p;
  local_90.piece_._M_len = pbVar1->_M_string_length;
  local_c0.piece_ = absl::lts_20250127::NullSafeStringView("()");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_e0,(lts_20250127 *)local_60,&local_90,&local_c0,(AlphaNum *)c.obj);
  tVar4._M_str = local_e0._M_dataplus._M_p;
  tVar4._M_len = local_e0._M_string_length;
  (*create_value.invoker_)(&local_120,VVar2,tVar4);
  pbVar1 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,&local_100);
  std::__cxx11::string::operator=((string *)pbVar1,(string *)&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_e0);
  return;
}

Assistant:

void AddPrimitiveVariableForThisAndOther(
    absl::string_view this_variable_name, absl::string_view other_variable_name,
    absl::FunctionRef<std::string(absl::string_view)> create_value,
    absl::flat_hash_map<absl::string_view, std::string>* variables) {
  (*variables)[this_variable_name] =
      create_value(absl::StrCat((*variables)["name"], "_"));
  (*variables)[other_variable_name] = create_value(
      absl::StrCat("other.get", (*variables)["capitalized_name"], "()"));
}